

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O2

void __thiscall enact::CompileContext::reportErrorAt(CompileContext *this,Token *token,string *msg)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cerr,"[line ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,"] Error");
  if (token->type == ERROR) {
    std::operator<<((ostream *)&std::cerr,":\n");
  }
  else {
    if (token->type == END_OF_FILE) {
      poVar2 = std::operator<<((ostream *)&std::cerr," at end: ");
      poVar2 = std::operator<<(poVar2,(string *)msg);
      std::operator<<(poVar2,"\n\n");
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr," at ");
    bVar1 = std::operator==(&token->lexeme,"\n");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"newline",(allocator<char> *)&local_50);
    }
    else {
      std::operator+(&local_50,"\'",&token->lexeme);
      std::operator+(&local_70,&local_50,"\'");
    }
    poVar2 = std::operator<<(poVar2,(string *)&local_70);
    std::operator<<(poVar2,":\n");
    std::__cxx11::string::~string((string *)&local_70);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"    ");
  bVar1 = std::operator==(&token->lexeme,"\n");
  getSourceLine_abi_cxx11_(&local_70,this,token->line - (uint)bVar1);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  std::operator<<(poVar2,"\n    ");
  std::__cxx11::string::~string((string *)&local_70);
  for (uVar4 = 1; uVar3 = (token->lexeme)._M_string_length, uVar4 <= token->col - uVar3;
      uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&std::cerr," ");
  }
  for (uVar4 = 1; uVar4 <= uVar3; uVar4 = uVar4 + 1) {
    std::operator<<((ostream *)&std::cerr,"^");
    uVar3 = (token->lexeme)._M_string_length;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"\n");
  poVar2 = std::operator<<(poVar2,(string *)msg);
  std::operator<<(poVar2,"\n\n");
  return;
}

Assistant:

void CompileContext::reportErrorAt(const Token &token, const std::string &msg) {
        std::cerr << "[line " << token.line << "] Error";

        if (token.type == TokenType::END_OF_FILE) {
            std::cerr << " at end: " << msg << "\n\n";
        } else {
            if (token.type == TokenType::ERROR) {
                std::cerr << ":\n";
            } else {
                std::cerr << " at " << (token.lexeme == "\n" ? "newline" : "'" + token.lexeme + "'") << ":\n";
            }

            std::cerr << "    " << getSourceLine(token.lexeme == "\n" ? token.line - 1 : token.line) << "\n    ";
            for (int i = 1; i <= token.col - token.lexeme.size(); ++i) {
                std::cerr << " ";
            }

            for (int i = 1; i <= token.lexeme.size(); ++i) {
                std::cerr << "^";
            }
            std::cerr << "\n" << msg << "\n\n";
        }
    }